

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# regexp.cpp
# Opt level: O1

void __thiscall mjs::regexp::~regexp(regexp *this)

{
  anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
  *paVar1;
  pointer pwVar2;
  
  pwVar2 = (this->pattern_)._M_dataplus._M_p;
  paVar1 = &(this->pattern_).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
       *)pwVar2 != paVar1) {
    operator_delete(pwVar2,paVar1->_M_allocated_capacity * 4 + 4);
  }
  std::unique_ptr<mjs::regexp::impl,_std::default_delete<mjs::regexp::impl>_>::~unique_ptr
            (&this->impl_);
  return;
}

Assistant:

regexp::~regexp() = default;